

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

void __thiscall ctemplate::TemplateCache::TemplateCache(TemplateCache *this)

{
  unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
  *this_00;
  unordered_map<ctemplate::TemplateCache::RefcountedTemplate_*,_int,_ctemplate::TemplateCache::RefTplPtrHash,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>_>
  *this_01;
  Mutex *pMVar1;
  TemplateCache *this_local;
  
  this_00 = (unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
             *)operator_new(0x38);
  std::
  unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
  ::unordered_map(this_00);
  this->parsed_template_cache_ = this_00;
  this->is_frozen_ = false;
  (this->search_path_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->search_path_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->search_path_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->search_path_);
  this_01 = (unordered_map<ctemplate::TemplateCache::RefcountedTemplate_*,_int,_ctemplate::TemplateCache::RefTplPtrHash,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>_>
             *)operator_new(0x38);
  std::
  unordered_map<ctemplate::TemplateCache::RefcountedTemplate_*,_int,_ctemplate::TemplateCache::RefTplPtrHash,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>_>
  ::unordered_map(this_01);
  this->get_template_calls_ = this_01;
  pMVar1 = (Mutex *)operator_new(8);
  Mutex::Mutex(pMVar1);
  this->mutex_ = pMVar1;
  pMVar1 = (Mutex *)operator_new(8);
  Mutex::Mutex(pMVar1);
  this->search_path_mutex_ = pMVar1;
  return;
}

Assistant:

TemplateCache::TemplateCache()
    : parsed_template_cache_(new TemplateMap),
      is_frozen_(false),
      search_path_(),
      get_template_calls_(new TemplateCallMap),
      mutex_(new Mutex),
      search_path_mutex_(new Mutex) {
}